

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_v2_local.c
# Opt level: O3

int main(void)

{
  char cVar1;
  long lVar2;
  long lVar3;
  uint8_t *footer;
  uint8_t message [5];
  uint8_t foot [7];
  size_t footer_len;
  size_t message_len_dec;
  uint8_t key [32];
  undefined8 local_60;
  undefined4 local_58;
  undefined1 local_54;
  undefined4 local_50;
  undefined3 uStack_4c;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 local_38 [40];
  
  cVar1 = paseto_init();
  if (cVar1 == '\0') {
    main_cold_1();
LAB_0010130a:
    main_cold_2();
  }
  else {
    cVar1 = paseto_v2_local_load_key_base64(local_38,"jPGxsBcnjnruJJe3cF4dnjo1LVM-g8O6ktboqggzi2c");
    if (cVar1 == '\0') goto LAB_0010130a;
    local_54 = 0;
    local_58 = 0x74736574;
    uStack_4c = 0x7265;
    local_50 = 0x746f6f66;
    lVar2 = paseto_v2_local_encrypt(&local_58,4,local_38,&local_50,6);
    if (lVar2 != 0) {
      printf("encrypted: %s\n",lVar2);
      local_40 = 0;
      local_48 = 0;
      lVar3 = paseto_v2_local_decrypt(lVar2,&local_40,local_38,&local_60);
      if (lVar3 != 0) {
        paseto_free(lVar2);
        printf("decrypted: %s\nfooter: %s\n",lVar3,local_60);
        paseto_free(lVar3);
        return 0;
      }
      goto LAB_00101314;
    }
  }
  main_cold_4();
LAB_00101314:
  main_cold_3();
  halt_baddata();
}

Assistant:

int main() {
    if (!paseto_init()) {
        fprintf(stderr, "Failed to initialize libpaseto\n");
        exit(-1);
    }

    uint8_t key[paseto_v2_LOCAL_KEYBYTES];
    if (!paseto_v2_local_load_key_base64(key,
            "jPGxsBcnjnruJJe3cF4dnjo1LVM-g8O6ktboqggzi2c")) {
        perror("Failed to load key");
        exit(-1);
    }
    const uint8_t message[] = "test";
    size_t message_len = sizeof(message) - 1;
    const uint8_t foot[] = "footer";
    size_t foot_len = sizeof(foot) - 1;
    char *enc = paseto_v2_local_encrypt(
            message, message_len, key, foot, foot_len);
    if (!enc) {
        perror("paseto_v2_local_encrypt failed");
        exit(-1);
    }
    printf("encrypted: %s\n", enc);

    size_t message_len_dec = 0;
    size_t footer_len = 0;
    uint8_t *footer;
    uint8_t *message_dec = paseto_v2_local_decrypt(
            enc, &message_len_dec, key, &footer, &footer_len);
    if (!message_dec) {
        perror("paseto_v2_local_decrypt failed");
        exit(-1);
    }
    paseto_free(enc);
    printf("decrypted: %s\nfooter: %s\n", message_dec, footer);
    paseto_free(message_dec);
}